

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O2

void __thiscall OpenMD::AngleR::processHistogram(AngleR *this)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  
  uVar4 = 0;
  while( true ) {
    uVar6 = (ulong)uVar4;
    pdVar2 = (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= uVar6) break;
    iVar1 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    if (iVar1 < 1) {
      (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = 0.0;
    }
    else {
      pdVar3 = (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[uVar6] = pdVar2[uVar6] / (double)iVar1 + pdVar3[uVar6];
    }
    poVar5 = std::operator<<((ostream *)&std::cerr," count = ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar5,
                        (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6]);
    std::operator<<(poVar5," avgAngle = ");
    poVar5 = std::ostream::_M_insert<double>
                       ((this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar6]);
    std::operator<<(poVar5,"\n");
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void AngleR::processHistogram() {
    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      if (count_[i] > 0)
        avgAngleR_[i] += histogram_[i] / count_[i];
      else
        avgAngleR_[i] = 0.0;

      std::cerr << " count = " << count_[i] << " avgAngle = " << avgAngleR_[i]
                << "\n";
    }
  }